

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpointer.c
# Opt level: O3

void xmlXPtrRangeInsideFunction(xmlXPathParserContextPtr ctxt,int nargs)

{
  xmlXPathObjectType xVar1;
  int *piVar2;
  int *piVar3;
  xmlGenericErrorFunc p_Var4;
  xmlElementType xVar5;
  xmlXPathObjectPtr pxVar6;
  xmlXPathObjectPtr obj;
  xmlLocationSetPtr cur;
  xmlGenericErrorFunc *pp_Var7;
  void **ppvVar8;
  _xmlNode *p_Var9;
  int iVar10;
  xmlNodePtr start;
  int startindex;
  xmlNodePtr start_00;
  long lVar11;
  
  if (ctxt == (xmlXPathParserContextPtr)0x0) {
    return;
  }
  if (nargs != 1) {
    iVar10 = 0xc;
    goto LAB_001eb212;
  }
  if (ctxt->valueNr <= ctxt->valueFrame) {
    iVar10 = 0x17;
    goto LAB_001eb212;
  }
  if ((ctxt->value == (xmlXPathObjectPtr)0x0) ||
     ((xVar1 = ctxt->value->type, xVar1 != XPATH_NODESET && (xVar1 != XPATH_LOCATIONSET)))) {
    iVar10 = 0xb;
    goto LAB_001eb212;
  }
  pxVar6 = valuePop(ctxt);
  obj = pxVar6;
  if (pxVar6->type == XPATH_NODESET) {
    obj = xmlXPtrNewLocationSetNodeSet(pxVar6->nodesetval);
    xmlXPathFreeObject(pxVar6);
    if (obj != (xmlXPathObjectPtr)0x0) goto LAB_001eafd0;
  }
  else {
LAB_001eafd0:
    cur = (xmlLocationSetPtr)(*xmlMalloc)(0x10);
    if (cur != (xmlLocationSetPtr)0x0) {
      cur->locNr = 0;
      cur->locMax = 0;
      cur->locTab = (xmlXPathObjectPtr *)0x0;
      piVar2 = (int *)obj->user;
      if ((piVar2 != (int *)0x0) && (0 < *piVar2)) {
        lVar11 = 0;
        do {
          piVar3 = *(int **)(*(long *)(piVar2 + 2) + lVar11 * 8);
          if (((piVar3 == (int *)0x0) || (ctxt->context == (xmlXPathContextPtr)0x0)) ||
             (ctxt->context->doc == (xmlDocPtr)0x0)) {
LAB_001eb0c9:
            pxVar6 = (xmlXPathObjectPtr)0x0;
          }
          else {
            if (*piVar3 != 6) {
              if (*piVar3 == 5) {
                start = *(xmlNodePtr *)(piVar3 + 10);
                xVar5 = start->type;
                if (xVar5 < XML_DTD_NODE) {
                  if ((0x3226U >> (xVar5 & (XML_ATTRIBUTE_DECL|XML_ELEMENT_DECL)) & 1) == 0)
                  goto LAB_001eb12d;
                  iVar10 = 0;
                  for (p_Var9 = start->children; p_Var9 != (_xmlNode *)0x0; p_Var9 = p_Var9->next) {
                    if ((p_Var9->type < XML_DTD_NODE) &&
                       ((0x2202U >> (p_Var9->type & (XML_ATTRIBUTE_DECL|XML_ELEMENT_DECL)) & 1) != 0
                       )) {
                      iVar10 = iVar10 + 1;
                    }
                  }
LAB_001eb123:
                  startindex = 0;
                  start_00 = start;
                  goto LAB_001eb155;
                }
              }
              else {
                pp_Var7 = __xmlGenericError();
                p_Var4 = *pp_Var7;
                ppvVar8 = __xmlGenericErrorContext();
                (*p_Var4)(*ppvVar8,"Unimplemented block at %s:%d\n",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/JFLarvoire[P]libxml2/xpointer.c"
                          ,0x868);
              }
              goto LAB_001eb0c9;
            }
            start_00 = *(xmlNodePtr *)(piVar3 + 10);
            start = *(xmlNodePtr *)(piVar3 + 0xe);
            if (start == (xmlNodePtr)0x0) {
              xVar5 = start_00->type;
              if (XML_HTML_DOCUMENT_NODE < xVar5) goto LAB_001eb0c9;
              start = start_00;
              if ((0x3226U >> (xVar5 & (XML_ATTRIBUTE_DECL|XML_ELEMENT_DECL)) & 1) != 0) {
                iVar10 = 0;
                for (p_Var9 = start_00->children; p_Var9 != (_xmlNode *)0x0; p_Var9 = p_Var9->next)
                {
                  if ((p_Var9->type < XML_DTD_NODE) &&
                     ((0x2202U >> (p_Var9->type & (XML_ATTRIBUTE_DECL|XML_ELEMENT_DECL)) & 1) != 0))
                  {
                    iVar10 = iVar10 + 1;
                  }
                }
                goto LAB_001eb123;
              }
LAB_001eb12d:
              pxVar6 = (xmlXPathObjectPtr)0x0;
              if ((0x198U >> (xVar5 & (XML_ATTRIBUTE_DECL|XML_ELEMENT_DECL)) & 1) != 0) {
                if (start->content != (xmlChar *)0x0) {
                  iVar10 = xmlStrlen(start->content);
                  startindex = 0;
                  start_00 = start;
                  goto LAB_001eb155;
                }
                pxVar6 = xmlXPtrNewRangeInternal(start,0,start,0);
                xmlXPtrRangeCheckOrder(pxVar6);
              }
            }
            else {
              startindex = piVar3[0xc];
              iVar10 = piVar3[0x10];
LAB_001eb155:
              pxVar6 = xmlXPtrNewRange(start_00,startindex,start,iVar10);
            }
          }
          xmlXPtrLocationSetAdd(cur,pxVar6);
          lVar11 = lVar11 + 1;
        } while (lVar11 < *piVar2);
      }
      pxVar6 = (xmlXPathObjectPtr)(*xmlMalloc)(0x48);
      if (pxVar6 == (xmlXPathObjectPtr)0x0) {
        xmlXPtrErrMemory("allocating locationset");
      }
      else {
        *(undefined8 *)pxVar6 = 0;
        pxVar6->nodesetval = (xmlNodeSetPtr)0x0;
        pxVar6->stringval = (xmlChar *)0x0;
        pxVar6->user = (void *)0x0;
        *(undefined8 *)&pxVar6->index = 0;
        pxVar6->user2 = (void *)0x0;
        *(undefined8 *)&pxVar6->boolval = 0;
        pxVar6->floatval = 0.0;
        *(undefined8 *)&pxVar6->index2 = 0;
        pxVar6->type = XPATH_LOCATIONSET;
        pxVar6->user = cur;
      }
      valuePush(ctxt,pxVar6);
      xmlXPathFreeObject(obj);
      return;
    }
    xmlXPtrErrMemory("allocating locationset");
    xmlXPathFreeObject(obj);
  }
  iVar10 = 0xf;
LAB_001eb212:
  xmlXPathErr(ctxt,iVar10);
  return;
}

Assistant:

static void
xmlXPtrRangeInsideFunction(xmlXPathParserContextPtr ctxt, int nargs) {
    int i;
    xmlXPathObjectPtr set;
    xmlLocationSetPtr oldset;
    xmlLocationSetPtr newset;

    CHECK_ARITY(1);
    if ((ctxt->value == NULL) ||
	((ctxt->value->type != XPATH_LOCATIONSET) &&
	 (ctxt->value->type != XPATH_NODESET)))
        XP_ERROR(XPATH_INVALID_TYPE)

    set = valuePop(ctxt);
    if (set->type == XPATH_NODESET) {
	xmlXPathObjectPtr tmp;

	/*
	 * First convert to a location set
	 */
	tmp = xmlXPtrNewLocationSetNodeSet(set->nodesetval);
	xmlXPathFreeObject(set);
	if (tmp == NULL)
	     XP_ERROR(XPATH_MEMORY_ERROR)
	set = tmp;
    }

    /*
     * The loop is to compute the covering range for each item and add it
     */
    newset = xmlXPtrLocationSetCreate(NULL);
    if (newset == NULL) {
	xmlXPathFreeObject(set);
        XP_ERROR(XPATH_MEMORY_ERROR);
    }
    oldset = (xmlLocationSetPtr) set->user;
    if (oldset != NULL) {
        for (i = 0;i < oldset->locNr;i++) {
            xmlXPtrLocationSetAdd(newset,
                    xmlXPtrInsideRange(ctxt, oldset->locTab[i]));
        }
    }

    /*
     * Save the new value and cleanup
     */
    valuePush(ctxt, xmlXPtrWrapLocationSet(newset));
    xmlXPathFreeObject(set);
}